

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_synaptic_impairment(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffff80,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa4);
    if (bVar1) {
      send_to_char((char *)in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      bVar1 = is_affected(in_RCX,(int)gsn_synaptic_enhancement);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffff80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        act((char *)in_stack_ffffffffffffff80,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
        affect_strip(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      else {
        init_affect((AFFECT_DATA *)0x6d9175);
        get_spell_aftype(in_stack_ffffffffffffff68);
        affect_to_char(in_stack_ffffffffffffff70,(AFFECT_DATA *)in_stack_ffffffffffffff68);
        act((char *)in_stack_ffffffffffffff80,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
        act((char *)in_stack_ffffffffffffff80,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
        act((char *)in_stack_ffffffffffffff80,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      }
    }
  }
  return;
}

Assistant:

void spell_synaptic_impairment(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("They are already affected by synaptic impairment.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_MENTAL))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_synaptic_enhancement))
	{
		send_to_char("Your mind clouds slightly as your synaptic enhancement wears off.\n\r", victim);
		act("$n appears to be thinking normally again.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, gsn_synaptic_enhancement);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 5;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	act("You disrupt $N's ability to focus with a controlled electrical burst!", ch, 0, victim, TO_CHAR);
	act("$n disrupts $N's ability to focus with a controlled electrical burst!", ch, 0, victim, TO_NOTVICT);
	act("Your mind clouds and you find concentration somewhat more difficult.", ch, 0, victim, TO_VICT);
}